

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__decode_uint16_linear_scaled_AR(float *decodep,int width_times_channels,void *inputp)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined1 auVar3 [12];
  undefined8 uVar4;
  float *pfVar5;
  bool bVar6;
  __m128i zero;
  __m128 of1;
  __m128 of0;
  __m128i o1;
  __m128i o0;
  __m128i i;
  unsigned_short *end_input_m8;
  unsigned_short *input;
  float *decode_end;
  float *decode;
  void *inputp_local;
  int width_times_channels_local;
  float *decodep_local;
  ushort local_e8;
  ushort uStack_e6;
  ushort uStack_e4;
  ushort uStack_e2;
  ushort uStack_90;
  ushort uStack_8e;
  ushort uStack_8c;
  ushort uStack_8a;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  uint uStack_64;
  uint uStack_5c;
  uint uStack_54;
  uint uStack_4c;
  
  pfVar5 = decodep + width_times_channels;
  if (width_times_channels < 8) {
    end_input_m8 = (unsigned_short *)inputp;
    for (decode_end = decodep + 4; decode_end <= pfVar5; decode_end = decode_end + 4) {
      decode_end[-4] = (float)end_input_m8[1] * 1.5259022e-05;
      decode_end[-3] = (float)*end_input_m8 * 1.5259022e-05;
      decode_end[-2] = (float)end_input_m8[3] * 1.5259022e-05;
      decode_end[-1] = (float)end_input_m8[2] * 1.5259022e-05;
      end_input_m8 = end_input_m8 + 4;
    }
    for (decode_end = decode_end + -4; decode_end < pfVar5; decode_end = decode_end + 2) {
      *decode_end = (float)end_input_m8[1] * 1.5259022e-05;
      decode_end[1] = (float)*end_input_m8 * 1.5259022e-05;
      end_input_m8 = end_input_m8 + 2;
    }
  }
  else {
    end_input_m8 = (unsigned_short *)inputp;
    decode_end = decodep;
    do {
      do {
        uVar2 = *(undefined8 *)end_input_m8;
        uVar4 = *(undefined8 *)(end_input_m8 + 4);
        local_e8 = (ushort)uVar2;
        uStack_e6 = (ushort)((ulong)uVar2 >> 0x10);
        uStack_e4 = (ushort)((ulong)uVar2 >> 0x20);
        uStack_e2 = (ushort)((ulong)uVar2 >> 0x30);
        uStack_90 = (ushort)uVar4;
        uStack_8e = (ushort)((ulong)uVar4 >> 0x10);
        uStack_8c = (ushort)((ulong)uVar4 >> 0x20);
        uStack_8a = (ushort)((ulong)uVar4 >> 0x30);
        uStack_54 = (uint)uStack_e6;
        uStack_4c = (uint)uStack_e2;
        uStack_64 = (uint)uStack_8e;
        uStack_5c = (uint)uStack_8a;
        uVar2 = CONCAT26((short)((uint)((float)uStack_54 * 1.5259022e-05) >> 0x10),
                         CONCAT24(SUB42((float)uStack_54 * 1.5259022e-05,0),
                                  (float)local_e8 * 1.5259022e-05));
        auVar3._8_2_ = SUB42((float)uStack_e4 * 1.5259022e-05,0);
        auVar3._0_8_ = uVar2;
        auVar3._10_2_ = (short)((uint)((float)uStack_e4 * 1.5259022e-05) >> 0x10);
        auVar1._12_2_ = SUB42((float)uStack_4c * 1.5259022e-05,0);
        auVar1._0_12_ = auVar3;
        auVar1._14_2_ = (short)((uint)((float)uStack_4c * 1.5259022e-05) >> 0x10);
        uStack_74 = (undefined4)((ulong)uVar2 >> 0x20);
        uStack_70 = auVar3._8_4_;
        uStack_6c = auVar1._12_4_;
        *(ulong *)decode_end = CONCAT44((float)local_e8 * 1.5259022e-05,uStack_74);
        *(ulong *)(decode_end + 2) = CONCAT44(uStack_70,uStack_6c);
        *(ulong *)(decode_end + 4) =
             CONCAT44((float)uStack_90 * 1.5259022e-05,(float)uStack_64 * 1.5259022e-05);
        *(ulong *)(decode_end + 6) =
             CONCAT44((float)uStack_8c * 1.5259022e-05,(float)uStack_5c * 1.5259022e-05);
        decode_end = decode_end + 8;
        end_input_m8 = end_input_m8 + 8;
      } while (decode_end <= pfVar5 + -8);
      bVar6 = decode_end != pfVar5;
      end_input_m8 = (unsigned_short *)((long)inputp + (long)width_times_channels * 2 + -0x10);
      decode_end = pfVar5 + -8;
    } while (bVar6);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__decode_uint16_linear_scaled)( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float * decode_end = (float*) decode + width_times_channels;
  unsigned short const * input = (unsigned short const *)inputp;

  #ifdef STBIR_SIMD
  unsigned short const * end_input_m8 = input + width_times_channels - 8;
  if ( width_times_channels >= 8 )
  {
    decode_end -= 8;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      #ifdef STBIR_SIMD8
      stbir__simdi i; stbir__simdi8 o;
      stbir__simdf8 of;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi8_expand_u16_to_u32( o, i );
      stbir__simdi8_convert_i32_to_float( of, o );
      stbir__simdf8_mult( of, of, STBIR_max_uint16_as_float_inverted8);
      stbir__decode_simdf8_flip( of );
      stbir__simdf8_store( decode + 0, of );
      #else
      stbir__simdi i, o0, o1;
      stbir__simdf of0, of1;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi_expand_u16_to_u32( o0,o1,i );
      stbir__simdi_convert_i32_to_float( of0, o0 );
      stbir__simdi_convert_i32_to_float( of1, o1 );
      stbir__simdf_mult( of0, of0, STBIR__CONSTF(STBIR_max_uint16_as_float_inverted) );
      stbir__simdf_mult( of1, of1, STBIR__CONSTF(STBIR_max_uint16_as_float_inverted));
      stbir__decode_simdf4_flip( of0 );
      stbir__decode_simdf4_flip( of1 );
      stbir__simdf_store( decode + 0,  of0 );
      stbir__simdf_store( decode + 4,  of1 );
      #endif
      decode += 8;
      input += 8;
      if ( decode <= decode_end )
        continue;
      if ( decode == ( decode_end + 8 ) )
        break;
      decode = decode_end; // backup and do last couple
      input = end_input_m8;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode <= decode_end )
  {
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0-4] = ((float)(input[stbir__decode_order0])) * stbir__max_uint16_as_float_inverted;
    decode[1-4] = ((float)(input[stbir__decode_order1])) * stbir__max_uint16_as_float_inverted;
    decode[2-4] = ((float)(input[stbir__decode_order2])) * stbir__max_uint16_as_float_inverted;
    decode[3-4] = ((float)(input[stbir__decode_order3])) * stbir__max_uint16_as_float_inverted;
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = ((float)(input[stbir__decode_order0])) * stbir__max_uint16_as_float_inverted;
    #if stbir__coder_min_num >= 2
    decode[1] = ((float)(input[stbir__decode_order1])) * stbir__max_uint16_as_float_inverted;
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = ((float)(input[stbir__decode_order2])) * stbir__max_uint16_as_float_inverted;
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif
}